

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  pointer pBVar4;
  undefined8 uVar5;
  int *piVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  type_conflict5 tVar8;
  double *pdVar9;
  cpp_dec_float<50U,_int,_void> *u;
  Breakpoint *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  int *local_1e8;
  int local_1dc;
  cpp_dec_float<50U,_int,_void> *local_1d8;
  cpp_dec_float<50U,_int,_void> *local_1d0;
  cpp_dec_float<50U,_int,_void> local_1c8;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_188;
  int local_17c;
  cpp_dec_float<50U,_int,_void> local_178;
  int *local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  Breakpoint local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b8;
  int *local_78;
  int *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_228.m_backend.fpclass = cpp_dec_float_finite;
  local_228.m_backend.prec_elem = 10;
  local_228.m_backend.data._M_elems[0] = 0;
  local_228.m_backend.data._M_elems[1] = 0;
  local_228.m_backend.data._M_elems[2] = 0;
  local_228.m_backend.data._M_elems[3] = 0;
  local_228.m_backend.data._M_elems[4] = 0;
  local_228.m_backend.data._M_elems[5] = 0;
  local_228.m_backend.data._M_elems._24_5_ = 0;
  local_228.m_backend.data._M_elems[7]._1_3_ = 0;
  local_228.m_backend.data._M_elems._32_5_ = 0;
  local_228.m_backend.data._M_elems[9]._1_3_ = 0;
  local_228.m_backend.exp = 0;
  local_228.m_backend.neg = false;
  local_1e8 = nBp;
  local_140 = minIdx;
  if (*nBp == 0) {
    pdVar9 = (double *)infinity();
    this_00 = &local_f8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)this_00,*pdVar9,(type *)0x0);
  }
  else {
    iVar3 = *minIdx;
    pBVar4 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = pBVar4 + iVar3;
    local_f8.val.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pBVar4[iVar3].val.m_backend + 0x20);
    local_f8.val.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pBVar4[iVar3].val.m_backend;
    local_f8.val.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pBVar4[iVar3].val.m_backend + 8);
    puVar2 = (uint *)((long)&pBVar4[iVar3].val.m_backend + 0x10);
    local_f8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_f8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  }
  local_b8.m_backend.data._M_elems[8] = local_f8.val.m_backend.data._M_elems[8];
  local_b8.m_backend.data._M_elems[9] = local_f8.val.m_backend.data._M_elems[9];
  local_b8.m_backend.data._M_elems[4] = local_f8.val.m_backend.data._M_elems[4];
  local_b8.m_backend.data._M_elems[5] = local_f8.val.m_backend.data._M_elems[5];
  local_b8.m_backend.data._M_elems[6] = local_f8.val.m_backend.data._M_elems[6];
  local_b8.m_backend.data._M_elems[7] = local_f8.val.m_backend.data._M_elems[7];
  local_b8.m_backend.data._M_elems[0] = local_f8.val.m_backend.data._M_elems[0];
  local_b8.m_backend.data._M_elems[1] = local_f8.val.m_backend.data._M_elems[1];
  local_b8.m_backend.data._M_elems[2] = local_f8.val.m_backend.data._M_elems[2];
  local_b8.m_backend.data._M_elems[3] = local_f8.val.m_backend.data._M_elems[3];
  local_b8.m_backend.exp = *(int *)((long)&(this_00->val).m_backend + 0x28);
  local_b8.m_backend.neg = *(bool *)((long)&(this_00->val).m_backend + 0x2c);
  local_b8.m_backend._48_8_ = *(undefined8 *)((long)&(this_00->val).m_backend + 0x30);
  local_78 = idx + nnz;
  pnVar1 = &(this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).epsilon;
  local_1d0 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend;
  local_188 = &this->breakpoints;
  local_1d8 = &local_138;
  do {
    if (local_78 <= idx) {
      return;
    }
    iVar3 = *idx;
    local_f8.val.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(upd[iVar3].m_backend.data._M_elems + 8);
    local_f8.val.m_backend.data._M_elems._0_8_ = *(undefined8 *)upd[iVar3].m_backend.data._M_elems;
    local_f8.val.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(upd[iVar3].m_backend.data._M_elems + 2);
    puVar2 = upd[iVar3].m_backend.data._M_elems + 4;
    local_f8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_f8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_f8.val.m_backend.exp = upd[iVar3].m_backend.exp;
    local_f8.val.m_backend.neg = upd[iVar3].m_backend.neg;
    local_f8.val.m_backend.fpclass = upd[iVar3].m_backend.fpclass;
    local_f8.val.m_backend.prec_elem = upd[iVar3].m_backend.prec_elem;
    uVar5 = *(undefined8 *)
             ((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.data._M_elems + 8);
    local_1c8.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_1c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_1c8.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_1c8.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.data._M_elems + 2);
    local_1c8.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.data._M_elems + 4);
    uVar5 = *(undefined8 *)
             ((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.data._M_elems + 6);
    local_1c8.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_1c8.exp =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.exp;
    local_1c8.neg =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.neg;
    local_1c8.fpclass =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.fpclass;
    local_1c8.prec_elem =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.prec_elem;
    local_1dc = iVar3;
    tVar8 = boost::multiprecision::operator>
                      (&local_f8.val,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1c8);
    local_70 = idx;
    if (tVar8) {
      pdVar9 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_1c8,-*pdVar9,(type *)0x0);
      tVar8 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&low[iVar3].m_backend,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1c8);
      if (tVar8) {
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 10;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems._24_5_ = 0;
        local_1c8.data._M_elems[7]._1_3_ = 0;
        local_1c8.data._M_elems._32_5_ = 0;
        local_1c8.data._M_elems[9]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1c8,&low[iVar3].m_backend,&vec[iVar3].m_backend);
        local_68.data._M_elems._0_8_ = local_68.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar8 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1c8,(int *)&local_68);
        pcVar7 = local_1d8;
        u = local_1d0;
        if (!tVar8) {
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems._24_5_ = 0;
          local_138.data._M_elems[7]._1_3_ = 0;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (local_1d8,local_1d0,&local_1c8);
          u = pcVar7;
        }
LAB_002811f5:
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 10;
        local_178.neg = false;
        local_178.exp = 0;
        local_178.data._M_elems[9]._1_3_ = 0;
        local_178.data._M_elems._32_5_ = 0;
        local_178.data._M_elems[7]._1_3_ = 0;
        local_178.data._M_elems._24_5_ = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_178,u,(cpp_dec_float<50U,_int,_void> *)&local_f8);
        piVar6 = local_1e8;
        local_228.m_backend.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
        local_228.m_backend.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
        local_228.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
        local_228.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
        local_228.m_backend.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
        local_228.m_backend.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
        local_228.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
        local_228.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
        local_228.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
        local_228.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
        local_228.m_backend.exp = local_178.exp;
        local_228.m_backend.neg = local_178.neg;
        local_228.m_backend.fpclass = local_178.fpclass;
        local_228.m_backend.prec_elem = local_178.prec_elem;
        pBVar4 = (local_188->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar4[*local_1e8].idx = local_1dc;
        iVar3 = *local_1e8;
        pBVar4[iVar3].src = src;
        *(undefined8 *)&pBVar4[iVar3].val.m_backend = local_178.data._M_elems._0_8_;
        *(undefined8 *)((long)&pBVar4[iVar3].val.m_backend + 8) = local_178.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pBVar4[iVar3].val.m_backend + 0x10);
        *(undefined8 *)puVar2 = local_178.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
        *(ulong *)((long)&pBVar4[iVar3].val.m_backend + 0x20) =
             CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
        *(int *)((long)&pBVar4[iVar3].val.m_backend + 0x28) = local_178.exp;
        *(bool *)((long)&pBVar4[iVar3].val.m_backend + 0x2c) = local_178.neg;
        *(undefined8 *)((long)&pBVar4[iVar3].val.m_backend + 0x30) = local_178._48_8_;
        tVar8 = boost::multiprecision::operator<(&local_228,&local_b8);
        iVar3 = *piVar6;
        if (tVar8) {
          local_b8.m_backend.data._M_elems[9]._1_3_ = local_228.m_backend.data._M_elems[9]._1_3_;
          local_b8.m_backend.data._M_elems._32_5_ = local_228.m_backend.data._M_elems._32_5_;
          local_b8.m_backend.data._M_elems[7]._1_3_ = local_228.m_backend.data._M_elems[7]._1_3_;
          local_b8.m_backend.data._M_elems._24_5_ = local_228.m_backend.data._M_elems._24_5_;
          local_b8.m_backend.data._M_elems[4] = local_228.m_backend.data._M_elems[4];
          local_b8.m_backend.data._M_elems[5] = local_228.m_backend.data._M_elems[5];
          local_b8.m_backend.data._M_elems[0] = local_228.m_backend.data._M_elems[0];
          local_b8.m_backend.data._M_elems[1] = local_228.m_backend.data._M_elems[1];
          local_b8.m_backend.data._M_elems[2] = local_228.m_backend.data._M_elems[2];
          local_b8.m_backend.data._M_elems[3] = local_228.m_backend.data._M_elems[3];
          local_b8.m_backend.exp = local_228.m_backend.exp;
          local_b8.m_backend.neg = local_228.m_backend.neg;
          local_b8.m_backend.fpclass = local_228.m_backend.fpclass;
          local_b8.m_backend.prec_elem = local_228.m_backend.prec_elem;
          *local_140 = iVar3;
        }
        *local_1e8 = iVar3 + 1;
      }
    }
    else {
      uVar5 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 8);
      local_1c8.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_1c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      local_1c8.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 2);
      local_1c8.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 4);
      uVar5 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 6);
      local_1c8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_1c8.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_1c8.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      local_1c8.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_1c8.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (local_1c8.fpclass != cpp_dec_float_finite || local_1c8.data._M_elems[0] != 0) {
        local_1c8.neg = (bool)(local_1c8.neg ^ 1);
      }
      tVar8 = boost::multiprecision::operator<
                        (&local_f8.val,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1c8);
      if (tVar8) {
        pdVar9 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_1c8,*pdVar9,(type *)0x0);
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&upp[iVar3].m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1c8);
        if (tVar8) {
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 10;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems._24_5_ = 0;
          local_1c8.data._M_elems[7]._1_3_ = 0;
          local_1c8.data._M_elems._32_5_ = 0;
          local_1c8.data._M_elems[9]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1c8,&upp[iVar3].m_backend,&vec[iVar3].m_backend);
          local_17c = 0;
          tVar8 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1c8,&local_17c);
          if (tVar8) {
            uVar5 = *(undefined8 *)((local_1d0->data)._M_elems + 8);
            local_138.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_138.data._M_elems._0_8_ = *(undefined8 *)(local_1d0->data)._M_elems;
            local_138.data._M_elems._8_8_ = *(undefined8 *)((local_1d0->data)._M_elems + 2);
            local_138.data._M_elems._16_8_ = *(undefined8 *)((local_1d0->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((local_1d0->data)._M_elems + 6);
            local_138.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_138.exp =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.exp;
            local_138.fpclass =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.fpclass;
            local_138.prec_elem =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.prec_elem;
            local_138.neg =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.neg;
          }
          else {
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_68,&local_1c8,local_1d0);
            local_138.data._M_elems[0] = local_68.data._M_elems[0];
            local_138.data._M_elems[1] = local_68.data._M_elems[1];
            local_138.data._M_elems[2] = local_68.data._M_elems[2];
            local_138.data._M_elems[3] = local_68.data._M_elems[3];
            local_138.data._M_elems._32_5_ = local_68.data._M_elems._32_5_;
            local_138.data._M_elems[9]._1_3_ = local_68.data._M_elems[9]._1_3_;
            local_138.data._M_elems[4] = local_68.data._M_elems[4];
            local_138.data._M_elems[5] = local_68.data._M_elems[5];
            local_138.data._M_elems._24_5_ = local_68.data._M_elems._24_5_;
            local_138.data._M_elems[7]._1_3_ = local_68.data._M_elems[7]._1_3_;
            local_138.exp = local_68.exp;
            local_138._48_8_ = local_68._48_8_;
            local_138.neg = local_68.neg;
          }
          u = local_1d8;
          if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
            local_1d8->neg = (bool)(local_138.neg ^ 1);
          }
          goto LAB_002811f5;
        }
      }
    }
    if ((int)((ulong)((long)(this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->breakpoints).data.
                           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= *local_1e8) {
      Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
      ::reSize(local_188,*local_1e8 * 2);
    }
    idx = local_70 + 1;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}